

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O0

void __thiscall TextProviderString::reverse(TextProviderString *this)

{
  bool bVar1;
  uint uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var3;
  reference pcVar4;
  TextProviderString *this_local;
  
  uVar2 = (*(this->super_TextProvider)._vptr_TextProvider[2])();
  if (((uVar2 & 1) != 0) &&
     (bVar1 = std::
              optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::has_value(&this->m_iterator), bVar1)) {
    (this->super_TextProvider).m_current_char_idx =
         (this->super_TextProvider).m_current_char_idx + -1;
    p_Var3 = std::
             optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value(&this->m_iterator);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator--(p_Var3);
    p_Var3 = std::
             optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value(&this->m_iterator);
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(p_Var3);
    (this->super_TextProvider).m_current_char = *pcVar4;
  }
  return;
}

Assistant:

void TextProviderString::reverse()
{
	if(is_valid() && m_iterator.has_value())
	{
		--m_current_char_idx;
		--m_iterator.value();
		m_current_char = *m_iterator.value();
	}
}